

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O2

int __thiscall VpuApiLegacy::init(VpuApiLegacy *this,EVP_PKEY_CTX *ctx)

{
  MppBufferGroup *ppvVar1;
  MppPacket *ppvVar2;
  MppCodingType coding;
  ulong uVar3;
  VpuApiMlvecStaticCfg *cfg;
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  RK_S32 RVar15;
  undefined4 uVar16;
  MPP_RET MVar17;
  int iVar18;
  uint uVar19;
  RK_U32 RVar20;
  MppFrameFormat MVar21;
  undefined4 uVar22;
  void *pvVar23;
  undefined8 uVar24;
  long in_RDX;
  char *pcVar25;
  MppParam pvVar26;
  uint uVar27;
  bool bVar28;
  undefined8 uStackY_60;
  MppEncSeiMode sei_mode;
  RK_U32 flag;
  undefined4 uStack_44;
  MppCtx local_40;
  MppApi *local_38;
  
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","init");
  }
  if ((this->mpp_ctx == (MppCtx)0x0) || (this->mpi == (MppApi *)0x0)) {
    _mpp_log_l(2,"vpu_api_legacy","found invalid context input",0);
    return -3;
  }
  iVar18 = *(int *)(ctx + 8);
  uVar24 = 0;
  if (iVar18 != 1) {
    if (iVar18 != 2) {
      _mpp_log_l(2,"vpu_api_legacy","found invalid codec type %d\n",0,iVar18);
      return -0x3eb;
    }
    uVar24 = 1;
  }
  MVar17 = mpp_init(this->mpp_ctx,uVar24,*(undefined4 *)(ctx + 0xc));
  if (MVar17 != MPP_OK) {
    pcVar25 = " init error. \n";
    uStackY_60 = 2;
    goto LAB_00105cc6;
  }
  if (iVar18 == 1) {
    (this->vpug).CodecType = *(RK_U32 *)(ctx + 8);
    uVar3 = *(ulong *)(ctx + 0x10);
    (this->vpug).ImgWidth = (int)uVar3;
    (this->vpug).ImgHeight = (int)(uVar3 >> 0x20);
    if (*(uint **)(ctx + 0x88) == (uint *)0x0) {
      uVar27 = 0;
    }
    else {
      uVar27 = **(uint **)(ctx + 0x88);
    }
    local_40 = this->mpp_ctx;
    local_38 = this->mpi;
    pvVar26 = this->frm_info;
    iVar18 = *(int *)(ctx + 0x44);
    uVar19 = (uint)uVar3;
    if (*(int *)(ctx + 0x40) == 10) {
      RVar20 = (uint)(iVar18 == 1) * 2 + 1;
    }
    else {
      if ((*(int *)(ctx + 0x40) == 0) && (iVar18 == 0)) {
        if ((int)uVar19 < 0) {
          RVar20 = ((uint)(uVar3 >> 0x1d) & 2) + 1;
          goto LAB_00105ec5;
        }
        bVar28 = 0x3fffffff < uVar19;
      }
      else {
        bVar28 = iVar18 == 1;
      }
      RVar20 = (uint)bVar28 * 2;
    }
LAB_00105ec5:
    (this->vpug).CodecType = RVar20;
    (this->vpug).ImgWidth = uVar19 & 0xffff;
    mpp_frame_set_width(pvVar26);
    mpp_frame_set_height(pvVar26,(this->vpug).ImgHeight);
    mpp_frame_set_fmt(pvVar26,uVar27 | (this->vpug).CodecType);
    (*local_38->control)(local_40,MPP_DEC_SET_FRAME_INFO,pvVar26);
    RVar20 = mpp_frame_get_hor_stride(pvVar26);
    (this->vpug).ImgHorStride = RVar20;
    RVar20 = mpp_frame_get_ver_stride(pvVar26);
    (this->vpug).ImgVerStride = RVar20;
    RVar20 = mpp_frame_get_buf_size(pvVar26);
    (this->vpug).BufSize = RVar20;
    if (in_RDX != 0) {
      _flag = (MppPacket)0x0;
      mpp_packet_init(&flag);
      mpp_packet_set_extra_data(_flag);
      (*this->mpi->decode_put_packet)(this->mpp_ctx,_flag);
      mpp_packet_deinit(&flag);
    }
    _flag = (MppPacket)((ulong)_flag & 0xffffffff00000000);
    MVar17 = (*this->mpi->control)(this->mpp_ctx,MPP_DEC_SET_ENABLE_DEINTERLACE,&flag);
    if (MVar17 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","disable mpp deinterlace failed ret %d\n","init",MVar17);
    }
  }
  else {
    cfg = *(VpuApiMlvecStaticCfg **)(ctx + 0x88);
    coding = *(MppCodingType *)(ctx + 0xc);
    sei_mode = MPP_ENC_SEI_MODE_DISABLE;
    _flag = (MppPacket)CONCAT44(uStack_44,100);
    MVar17 = (*this->mpi->control)(this->mpp_ctx,MPP_SET_INPUT_TIMEOUT,&flag);
    if (MVar17 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_SET_INPUT_TIMEOUT failed\n",0);
    }
    MVar17 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_SET_SEI_CFG,&sei_mode);
    if (MVar17 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n",0,MVar17);
    }
    ppvVar1 = &this->memGroup;
    if ((this->memGroup == (MppBufferGroup)0x0) &&
       (iVar18 = mpp_buffer_group_get(ppvVar1,1,0,"vpu_api_legacy","init"), iVar18 != 0)) {
      _mpp_log_l(2,"vpu_api_legacy","memGroup mpp_buffer_group_get failed %d\n",0,iVar18);
      return iVar18;
    }
    iVar18 = mpp_enc_cfg_init(&this->enc_cfg);
    if (iVar18 != 0) {
      _mpp_log_l(2,"vpu_api_legacy","mpp_enc_cfg_init failed %d\n",0,iVar18);
      mpp_buffer_group_put(*ppvVar1);
      *ppvVar1 = (MppBufferGroup)0x0;
      return iVar18;
    }
    MVar21 = vpu_pic_type_remap_to_mpp(cfg->format);
    this->format = MVar21;
    uVar24._0_2_ = cfg->width;
    uVar24._2_2_ = cfg->sar_width;
    uVar24._4_2_ = cfg->height;
    uVar24._6_2_ = cfg->sar_height;
    RVar4 = cfg->rc_mode;
    RVar5 = cfg->bitRate;
    RVar6 = cfg->framerate;
    RVar7 = cfg->qp;
    RVar8 = cfg->enableCabac;
    RVar9 = cfg->cabacInitIdc;
    RVar10 = cfg->format;
    RVar11 = cfg->intraPicRate;
    RVar12 = cfg->framerateout;
    RVar13 = cfg->profileIdc;
    RVar14 = cfg->levelIdc;
    RVar15 = cfg->magic;
    uVar22 = *(undefined4 *)&cfg->field_0x38;
    uVar16 = *(undefined4 *)&cfg->field_0x3c;
    (this->enc_param).width = (int)uVar24;
    (this->enc_param).height = (int)((ulong)uVar24 >> 0x20);
    (this->enc_param).rc_mode = RVar4;
    (this->enc_param).bitRate = RVar5;
    (this->enc_param).framerate = RVar6;
    (this->enc_param).qp = RVar7;
    (this->enc_param).enableCabac = RVar8;
    (this->enc_param).cabacInitIdc = RVar9;
    (this->enc_param).format = RVar10;
    (this->enc_param).intraPicRate = RVar11;
    (this->enc_param).framerateout = RVar12;
    (this->enc_param).profileIdc = RVar13;
    (this->enc_param).levelIdc = RVar14;
    (this->enc_param).reserved[0] = RVar15;
    (this->enc_param).reserved[1] = uVar22;
    (this->enc_param).reserved[2] = uVar16;
    MVar17 = vpu_api_mlvec_check_cfg(cfg);
    if ((MVar17 == MPP_OK) && (this->mlvec == (VpuApiMlvec)0x0)) {
      vpu_api_mlvec_init(&this->mlvec);
      vpu_api_mlvec_setup(this->mlvec,this->mpp_ctx,this->mpi,this->enc_cfg);
    }
    if (this->mlvec != (VpuApiMlvec)0x0) {
      vpu_api_mlvec_set_st_cfg(this->mlvec,cfg);
    }
    vpu_api_set_enc_cfg(this->mpp_ctx,this->mpi,this->enc_cfg,coding,this->format,
                        (EncParameter_t *)cfg);
    MVar17 = MPP_OK;
    if (this->mlvec == (VpuApiMlvec)0x0) {
      pvVar26 = this->enc_hdr_pkt;
      if (pvVar26 == (MppParam)0x0) {
        ppvVar2 = &this->enc_hdr_pkt;
        pvVar23 = this->enc_hdr_buf;
        if (pvVar23 == (void *)0x0) {
          this->enc_hdr_buf_size = 0x400;
          pvVar23 = (void *)mpp_osal_calloc("init",0x400);
          this->enc_hdr_buf = pvVar23;
          if (pvVar23 != (void *)0x0) goto LAB_001060ac;
        }
        else {
LAB_001060ac:
          mpp_packet_init(ppvVar2,pvVar23,(long)this->enc_hdr_buf_size);
        }
        pvVar26 = *ppvVar2;
        if (pvVar26 == (MppParam)0x0) {
          MVar17 = MPP_OK;
          _mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"enc_hdr_pkt","init",
                     0x1e0);
          if ((DAT_0011134b & 0x10) != 0) {
            abort();
          }
          pvVar26 = *ppvVar2;
          if (pvVar26 == (MppParam)0x0) goto LAB_00106141;
        }
      }
      MVar17 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_GET_HDR_SYNC,pvVar26);
      uVar22 = mpp_packet_get_length(this->enc_hdr_pkt);
      *(undefined4 *)(ctx + 0x20) = uVar22;
      uVar24 = mpp_packet_get_data(this->enc_hdr_pkt);
      *(undefined8 *)(ctx + 0x18) = uVar24;
    }
  }
LAB_00106141:
  this->init_ok = 1;
  if (((byte)vpu_api_debug & 1) == 0) {
    return MVar17;
  }
  pcVar25 = "leave\n";
  uStackY_60 = 4;
LAB_00105cc6:
  _mpp_log_l(uStackY_60,"vpu_api_legacy",pcVar25,"init");
  return MVar17;
}

Assistant:

RK_S32 VpuApiLegacy::init(VpuCodecContext *ctx, RK_U8 *extraData, RK_U32 extra_size)
{
    vpu_api_dbg_func("enter\n");

    MPP_RET ret = MPP_OK;
    MppCtxType type;

    if (mpp_ctx == NULL || mpi == NULL) {
        mpp_err("found invalid context input");
        return MPP_ERR_NULL_PTR;
    }

    if (CODEC_DECODER == ctx->codecType) {
        type = MPP_CTX_DEC;
    } else if (CODEC_ENCODER == ctx->codecType) {
        type = MPP_CTX_ENC;
    } else {
        mpp_err("found invalid codec type %d\n", ctx->codecType);
        return MPP_ERR_VPU_CODEC_INIT;
    }

    ret = mpp_init(mpp_ctx, type, (MppCodingType)ctx->videoCoding);
    if (ret) {
        mpp_err_f(" init error. \n");
        return ret;
    }

    if (MPP_CTX_ENC == type) {
        EncParameter_t *param = (EncParameter_t*)ctx->private_data;
        MppCodingType coding = (MppCodingType)ctx->videoCoding;
        MppPollType block = (MppPollType)VPU_API_ENC_INPUT_TIMEOUT;
        MppEncSeiMode sei_mode = MPP_ENC_SEI_MODE_DISABLE;

        /* setup input / output block mode */
        ret = mpi->control(mpp_ctx, MPP_SET_INPUT_TIMEOUT, (MppParam)&block);
        if (MPP_OK != ret)
            mpp_err("mpi control MPP_SET_INPUT_TIMEOUT failed\n");

        /* disable sei by default */
        ret = mpi->control(mpp_ctx, MPP_ENC_SET_SEI_CFG, &sei_mode);
        if (ret)
            mpp_err("mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n", ret);

        if (memGroup == NULL) {
            ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err("memGroup mpp_buffer_group_get failed %d\n", ret);
                return ret;
            }
        }

        ret = mpp_enc_cfg_init(&enc_cfg);
        if (ret) {
            mpp_err("mpp_enc_cfg_init failed %d\n", ret);
            mpp_buffer_group_put(memGroup);
            memGroup = NULL;
            return ret;
        }

        format = vpu_pic_type_remap_to_mpp((EncInputPictureType)param->format);

        memcpy(&enc_param, param, sizeof(enc_param));

        if (MPP_OK == vpu_api_mlvec_check_cfg(param)) {
            if (NULL == mlvec) {
                vpu_api_mlvec_init(&mlvec);
                vpu_api_mlvec_setup(mlvec, mpp_ctx, mpi, enc_cfg);
            }
        }

        if (mlvec)
            vpu_api_mlvec_set_st_cfg(mlvec, (VpuApiMlvecStaticCfg *)param);

        vpu_api_set_enc_cfg(mpp_ctx, mpi, enc_cfg, coding, format, param);

        if (!mlvec) {
            if (NULL == enc_hdr_pkt) {
                if (NULL == enc_hdr_buf) {
                    enc_hdr_buf_size = SZ_1K;
                    enc_hdr_buf = mpp_calloc_size(RK_U8, enc_hdr_buf_size);
                }

                if (enc_hdr_buf)
                    mpp_packet_init(&enc_hdr_pkt, enc_hdr_buf, enc_hdr_buf_size);
            }

            mpp_assert(enc_hdr_pkt);
            if (enc_hdr_pkt) {
                ret = mpi->control(mpp_ctx, MPP_ENC_GET_HDR_SYNC, enc_hdr_pkt);
                ctx->extradata_size = mpp_packet_get_length(enc_hdr_pkt);
                ctx->extradata      = mpp_packet_get_data(enc_hdr_pkt);
            }
        }
    } else { /* MPP_CTX_DEC */
        vpug.CodecType  = ctx->codecType;
        vpug.ImgWidth   = ctx->width;
        vpug.ImgHeight  = ctx->height;

        init_frame_info(ctx, mpp_ctx, mpi, frm_info, &vpug);

        if (extraData != NULL) {
            MppPacket pkt = NULL;

            mpp_packet_init(&pkt, extraData, extra_size);
            mpp_packet_set_extra_data(pkt);
            mpi->decode_put_packet(mpp_ctx, pkt);
            mpp_packet_deinit(&pkt);
        }

        RK_U32 flag = 0;
        ret = mpi->control(mpp_ctx, MPP_DEC_SET_ENABLE_DEINTERLACE, &flag);
        if (ret)
            mpp_err_f("disable mpp deinterlace failed ret %d\n", ret);
    }

    init_ok = 1;

    vpu_api_dbg_func("leave\n");
    return ret;
}